

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::SingleFailureChecker
          (SingleFailureChecker *this,TestPartResultArray *results,Type type,string *substr)

{
  pointer pcVar1;
  
  this->results_ = results;
  this->type_ = type;
  (this->substr_)._M_dataplus._M_p = (pointer)&(this->substr_).field_2;
  pcVar1 = (substr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->substr_,pcVar1,pcVar1 + substr->_M_string_length);
  return;
}

Assistant:

SingleFailureChecker:: SingleFailureChecker(
    const TestPartResultArray* results,
    TestPartResult::Type type,
    const string& substr)
    : results_(results),
      type_(type),
      substr_(substr) {}